

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

bool __thiscall
Parameter<std::pair<int,_int>_>::setData(Parameter<std::pair<int,_int>_> *this,string *sval)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)sval);
  bVar1 = Parameter<std::pair<int,int>>::internalSetData<std::__cxx11::string>
                    ((Parameter<std::pair<int,int>> *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

virtual bool setData(std::string sval) {
    return internalSetData<std::string>(sval);
  }